

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O3

void ft_trig_pseudo_rotate(PVG_FT_Vector *vec,PVG_FT_Angle theta)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  PVG_FT_Fixed *pPVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  lVar4 = vec->x;
  lVar2 = vec->y;
  lVar7 = lVar4;
  if (theta < -0x2d0000) {
    do {
      lVar4 = lVar2;
      lVar2 = -lVar7;
      uVar6 = theta + 0x5a0000;
      bVar10 = (ulong)theta < 0xffffffffff790000;
      lVar7 = lVar4;
      theta = uVar6;
    } while (bVar10);
  }
  else {
    uVar6 = theta;
    lVar7 = lVar2;
    if (0x2d0000 < theta) {
      do {
        lVar2 = lVar4;
        lVar4 = -lVar7;
        uVar6 = theta - 0x5a0000;
        bVar10 = 0x870000 < (ulong)theta;
        theta = uVar6;
        lVar7 = lVar2;
      } while (bVar10);
    }
  }
  pPVar5 = ft_trig_arctan_table;
  lVar3 = 1;
  lVar7 = 1;
  do {
    lVar8 = lVar7 + lVar2 >> ((byte)lVar3 & 0x3f);
    lVar9 = lVar7 + lVar4 >> ((byte)lVar3 & 0x3f);
    lVar1 = *pPVar5;
    if ((long)uVar6 < 0) {
      lVar9 = -lVar9;
    }
    else {
      lVar8 = -lVar8;
      lVar1 = -lVar1;
    }
    uVar6 = uVar6 + lVar1;
    lVar4 = lVar4 + lVar8;
    lVar2 = lVar2 + lVar9;
    pPVar5 = pPVar5 + 1;
    lVar7 = lVar7 * 2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x17);
  vec->x = lVar4;
  vec->y = lVar2;
  return;
}

Assistant:

static void ft_trig_pseudo_rotate(PVG_FT_Vector* vec, PVG_FT_Angle theta)
{
    PVG_FT_Int          i;
    PVG_FT_Fixed        x, y, xtemp, b;
    const PVG_FT_Fixed* arctanptr;

    x = vec->x;
    y = vec->y;

    /* Rotate inside [-PI/4,PI/4] sector */
    while (theta < -PVG_FT_ANGLE_PI4) {
        xtemp = y;
        y = -x;
        x = xtemp;
        theta += PVG_FT_ANGLE_PI2;
    }

    while (theta > PVG_FT_ANGLE_PI4) {
        xtemp = -y;
        y = x;
        x = xtemp;
        theta -= PVG_FT_ANGLE_PI2;
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for (i = 1, b = 1; i < PVG_FT_TRIG_MAX_ITERS; b <<= 1, i++) {
        PVG_FT_Fixed v1 = ((y + b) >> i);
        PVG_FT_Fixed v2 = ((x + b) >> i);
        if (theta < 0) {
            xtemp = x + v1;
            y = y - v2;
            x = xtemp;
            theta += *arctanptr++;
        } else {
            xtemp = x - v1;
            y = y + v2;
            x = xtemp;
            theta -= *arctanptr++;
        }
    }

    vec->x = x;
    vec->y = y;
}